

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::objectivec::DefaultValue_abi_cxx11_
          (string *__return_storage_ptr__,objectivec *this,FieldDescriptor *field)

{
  objectivec oVar1;
  string *src;
  long lVar2;
  Type TVar3;
  long *plVar4;
  EnumValueDescriptor *this_00;
  LogMessage *other;
  undefined8 uVar5;
  size_type *psVar6;
  char *pcVar7;
  unsigned_long i;
  EnumValueDescriptor *descriptor;
  char *pcVar8;
  objectivec *this_01;
  string bytes;
  undefined1 local_f0 [16];
  undefined1 local_e0 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  undefined1 local_98 [32];
  string local_78;
  string local_58;
  undefined1 local_38 [32];
  
  if (*(int *)(this + 0x4c) == 3) {
switchD_0022fcb4_caseD_a:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "nil";
    pcVar7 = "";
LAB_0022fc6c:
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar8,pcVar7);
    return __return_storage_ptr__;
  }
  this_01 = this;
  TVar3 = FieldDescriptor::type((FieldDescriptor *)this);
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar3 * 4)) {
  case 1:
    SimpleItoa_abi_cxx11_(__return_storage_ptr__,(protobuf *)(ulong)*(uint *)(this + 0xa0),(uint)i);
    return __return_storage_ptr__;
  case 2:
    SimpleItoa_abi_cxx11_((string *)local_f0,*(protobuf **)(this + 0xa0),i);
    plVar4 = (long *)std::__cxx11::string::append((char *)local_f0);
    break;
  case 3:
    SimpleItoa_abi_cxx11_((string *)local_f0,(protobuf *)(ulong)*(uint *)(this + 0xa0),(uint)i);
    plVar4 = (long *)std::__cxx11::string::append((char *)local_f0);
    break;
  case 4:
    SimpleItoa_abi_cxx11_((string *)local_f0,*(protobuf **)(this + 0xa0),i);
    plVar4 = (long *)std::__cxx11::string::append((char *)local_f0);
    break;
  case 5:
    SimpleDtoa_abi_cxx11_((string *)local_38,(protobuf *)this_01,*(double *)(this + 0xa0));
    HandleExtremeFloatingPoint(__return_storage_ptr__,(string *)local_38,false);
    local_98._16_8_ = local_38._16_8_;
    local_98._0_8_ = local_38._0_8_;
    if ((LogMessage *)local_38._0_8_ == (LogMessage *)(local_38 + 0x10)) {
      return __return_storage_ptr__;
    }
    goto LAB_0022ffc5;
  case 6:
    SimpleFtoa_abi_cxx11_(&local_58,(protobuf *)this_01,*(float *)(this + 0xa0));
    HandleExtremeFloatingPoint(__return_storage_ptr__,&local_58,true);
    local_98._16_8_ = local_58.field_2._M_allocated_capacity;
    local_98._0_8_ = local_58._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p == &local_58.field_2) {
      return __return_storage_ptr__;
    }
    goto LAB_0022ffc5;
  case 7:
    oVar1 = this[0xa0];
    pcVar8 = "NO";
    if ((ulong)(byte)oVar1 != 0) {
      pcVar8 = "YES";
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar7 = pcVar8 + (ulong)(byte)oVar1 + 2;
    goto LAB_0022fc6c;
  case 8:
    this_00 = FieldDescriptor::default_value_enum((FieldDescriptor *)this);
    EnumValueName_abi_cxx11_(__return_storage_ptr__,(objectivec *)this_00,descriptor);
    return __return_storage_ptr__;
  case 9:
    if ((this[0x98] != (objectivec)0x1) ||
       (src = *(string **)(this + 0xa0), src->_M_string_length == 0)) goto switchD_0022fcb4_caseD_a;
    TVar3 = FieldDescriptor::type((FieldDescriptor *)this);
    if (TVar3 != TYPE_BYTES) {
      CEscape((string *)local_98,src);
      EscapeTrigraphs((string *)(local_e0 + 0x28),(string *)local_98);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0,
                     "@\"",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_e0 + 0x28));
      std::operator+(__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0,
                     "\"");
      if ((LogMessage *)local_f0._0_8_ != (LogMessage *)local_e0) {
        operator_delete((void *)local_f0._0_8_,CONCAT44(local_e0._4_4_,local_e0._0_4_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_allocated_capacity != &local_a8) {
        operator_delete((void *)local_b8._M_allocated_capacity,local_a8._M_allocated_capacity + 1);
      }
      if ((LogMessage *)local_98._0_8_ == (LogMessage *)(local_98 + 0x10)) {
        return __return_storage_ptr__;
      }
      goto LAB_0022ffc5;
    }
    local_e0._0_4_ = ghtonl((uint32)src->_M_string_length);
    local_f0._8_8_ = (char *)0x4;
    local_e0._4_4_ = local_e0._4_4_ & 0xffffff00;
    local_f0._0_8_ = (LogMessage *)local_e0;
    std::__cxx11::string::_M_append(local_f0,(ulong)(src->_M_dataplus)._M_p);
    CEscape(&local_78,(string *)local_f0);
    EscapeTrigraphs((string *)local_98,&local_78);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_e0 + 0x28),"(NSData*)\"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_e0 + 0x28),"\"");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_allocated_capacity != &local_a8) {
      operator_delete((void *)local_b8._M_allocated_capacity,local_a8._M_allocated_capacity + 1);
    }
    if ((LogMessage *)local_98._0_8_ != (LogMessage *)(local_98 + 0x10)) {
      operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((LogMessage *)local_f0._0_8_ == (LogMessage *)local_e0) {
      return __return_storage_ptr__;
    }
    goto LAB_0022ffc0;
  case 10:
    goto switchD_0022fcb4_caseD_a;
  default:
    internal::LogMessage::LogMessage
              ((LogMessage *)local_f0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/objectivec/objectivec_helpers.cc"
               ,0x327);
    other = internal::LogMessage::operator<<((LogMessage *)local_f0,"Can\'t get here.");
    internal::LogFinisher::operator=((LogFinisher *)(local_e0 + 0x28),other);
    internal::LogMessage::~LogMessage((LogMessage *)local_f0);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    uVar5 = std::__throw_logic_error(anon_var_dwarf_1be);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_allocated_capacity != &local_a8) {
      operator_delete((void *)local_b8._M_allocated_capacity,local_a8._M_allocated_capacity + 1);
    }
    if ((LogMessage *)local_98._0_8_ != (LogMessage *)(local_98 + 0x10)) {
      operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((LogMessage *)local_f0._0_8_ != (LogMessage *)local_f0) {
      operator_delete((void *)local_f0._0_8_,CONCAT44(local_e0._4_4_,local_e0._0_4_) + 1);
    }
    _Unwind_Resume(uVar5);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar6 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar6) {
    lVar2 = plVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
  }
  __return_storage_ptr__->_M_string_length = plVar4[1];
  *plVar4 = (long)psVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((LogMessage *)local_f0._0_8_ != (LogMessage *)local_e0) {
LAB_0022ffc0:
    local_98._16_8_ = CONCAT44(local_e0._4_4_,local_e0._0_4_);
    local_98._0_8_ = local_f0._0_8_;
LAB_0022ffc5:
    operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string DefaultValue(const FieldDescriptor* field) {
  // Repeated fields don't have defaults.
  if (field->is_repeated()) {
    return "nil";
  }

  // Switch on cpp_type since we need to know which default_value_* method
  // of FieldDescriptor to call.
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT32:
      // gcc and llvm reject the decimal form of kint32min and kint64min.
      if (field->default_value_int32() == INT_MIN) {
        return "-0x80000000";
      }
      return SimpleItoa(field->default_value_int32());
    case FieldDescriptor::CPPTYPE_UINT32:
      return SimpleItoa(field->default_value_uint32()) + "U";
    case FieldDescriptor::CPPTYPE_INT64:
      // gcc and llvm reject the decimal form of kint32min and kint64min.
      if (field->default_value_int64() == LLONG_MIN) {
        return "-0x8000000000000000LL";
      }
      return SimpleItoa(field->default_value_int64()) + "LL";
    case FieldDescriptor::CPPTYPE_UINT64:
      return SimpleItoa(field->default_value_uint64()) + "ULL";
    case FieldDescriptor::CPPTYPE_DOUBLE:
      return HandleExtremeFloatingPoint(
          SimpleDtoa(field->default_value_double()), false);
    case FieldDescriptor::CPPTYPE_FLOAT:
      return HandleExtremeFloatingPoint(
          SimpleFtoa(field->default_value_float()), true);
    case FieldDescriptor::CPPTYPE_BOOL:
      return field->default_value_bool() ? "YES" : "NO";
    case FieldDescriptor::CPPTYPE_STRING: {
      const bool has_default_value = field->has_default_value();
      const string& default_string = field->default_value_string();
      if (!has_default_value || default_string.length() == 0) {
        // If the field is defined as being the empty string,
        // then we will just assign to nil, as the empty string is the
        // default for both strings and data.
        return "nil";
      }
      if (field->type() == FieldDescriptor::TYPE_BYTES) {
        // We want constant fields in our data structures so we can
        // declare them as static. To achieve this we cheat and stuff
        // a escaped c string (prefixed with a length) into the data
        // field, and cast it to an (NSData*) so it will compile.
        // The runtime library knows how to handle it.

        // Must convert to a standard byte order for packing length into
        // a cstring.
        uint32 length = ghtonl(default_string.length());
        string bytes((const char*)&length, sizeof(length));
        bytes.append(default_string);
        return "(NSData*)\"" + EscapeTrigraphs(CEscape(bytes)) + "\"";
      } else {
        return "@\"" + EscapeTrigraphs(CEscape(default_string)) + "\"";
      }
    }
    case FieldDescriptor::CPPTYPE_ENUM:
      return EnumValueName(field->default_value_enum());
    case FieldDescriptor::CPPTYPE_MESSAGE:
      return "nil";
  }

  // Some compilers report reaching end of function even though all cases of
  // the enum are handed in the switch.
  GOOGLE_LOG(FATAL) << "Can't get here.";
  return NULL;
}